

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O0

String * __thiscall stick::String::operator=(String *this,String *_other)

{
  String *_other_local;
  String *this_local;
  
  deallocate(this);
  this->m_allocator = _other->m_allocator;
  if (_other->m_cStr != (char *)0x0) {
    resize(this,_other->m_length);
    strcpy(this->m_cStr,_other->m_cStr);
  }
  return this;
}

Assistant:

inline String & operator=(const String & _other)
    {
        deallocate();
        //@TODO: By default we should keep the allocator we were using maybe?
        m_allocator = _other.m_allocator;
        if (_other.m_cStr)
        {
            resize(_other.m_length);
            strcpy(m_cStr, _other.m_cStr);
        }

        return *this;
    }